

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O0

void Ivy_TableProfile(Ivy_Man_t *p)

{
  uint local_18;
  int local_14;
  int Counter;
  int i;
  Ivy_Man_t *p_local;
  
  local_18 = 0;
  for (local_14 = 0; local_14 < p->nTableSize; local_14 = local_14 + 1) {
    if (p->pTable[local_14] == 0) {
      if (local_18 != 0) {
        printf("%d ",(ulong)local_18);
        local_18 = 0;
      }
    }
    else {
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void Ivy_TableProfile( Ivy_Man_t * p )
{
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
    {
        if ( p->pTable[i] )
            Counter++;
        else if ( Counter )
        {
            printf( "%d ", Counter );
            Counter = 0;
        }
    }
}